

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O1

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectTransformationMatrix
          (CXMeshFileLoader *this,matrix4 *mat)

{
  bool bVar1;
  char *this_00;
  double extraout_XMM0_Qa;
  double __x;
  double __x_00;
  double extraout_XMM0_Qa_00;
  double __x_01;
  double __x_02;
  string<char> local_30;
  
  bVar1 = readHeadOfDataObject(this,(stringc *)0x0);
  if (bVar1) {
    readMatrix(this,mat);
    bVar1 = checkForOneFollowingSemicolons(this);
    if (!bVar1) {
      os::Printer::log((Printer *)"No finishing semicolon in Transformation Matrix found in x file",
                       __x);
      core::string<char>::string(&local_30,this->Line);
      os::Printer::log(__x_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30.str._M_dataplus._M_p != &local_30.str.field_2) {
        operator_delete(local_30.str._M_dataplus._M_p,local_30.str.field_2._M_allocated_capacity + 1
                       );
      }
    }
    bVar1 = checkForClosingBrace(this);
    if (bVar1) {
      return true;
    }
    this_00 = "No closing brace in Transformation Matrix found in x file";
    __x_01 = extraout_XMM0_Qa_00;
  }
  else {
    this_00 = "No opening brace in Transformation Matrix found in x file";
    __x_01 = extraout_XMM0_Qa;
  }
  os::Printer::log((Printer *)this_00,__x_01);
  core::string<char>::string(&local_30,this->Line);
  os::Printer::log(__x_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30.str._M_dataplus._M_p != &local_30.str.field_2) {
    operator_delete(local_30.str._M_dataplus._M_p,local_30.str.field_2._M_allocated_capacity + 1);
  }
  this->ErrorState = true;
  return false;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectTransformationMatrix(core::matrix4 &mat)
{
#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: Reading Transformation Matrix", ELL_DEBUG);
#endif

	if (!readHeadOfDataObject()) {
		os::Printer::log("No opening brace in Transformation Matrix found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	readMatrix(mat);

	if (!checkForOneFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Transformation Matrix found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	if (!checkForClosingBrace()) {
		os::Printer::log("No closing brace in Transformation Matrix found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	return true;
}